

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,cpp_function *args,none *args_1,none *args_2,
          char (*args_3) [1])

{
  handle *this_00;
  object_api<pybind11::handle> *in_RSI;
  handle in_RDI;
  simple_collector<(pybind11::return_value_policy)1> *in_R8;
  PyObject *in_R9;
  cpp_function *in_stack_ffffffffffffffb8;
  none local_38;
  
  collect_arguments<(pybind11::return_value_policy)1,pybind11::cpp_function,pybind11::none,pybind11::none,char_const(&)[1],void>
            (in_stack_ffffffffffffffb8,&local_38,(none *)in_RDI.m_ptr,(char (*) [1])in_RSI);
  this_00 = derived(in_RSI);
  pybind11::handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call(in_R8,in_R9);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x39db7b);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}